

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Iterator __thiscall
Map<unsigned_int,_Error::Private::Str>::insert
          (Map<unsigned_int,_Error::Private::Str> *this,Item **cell,Item *parent,uint *key,
          Str *value)

{
  usize uVar1;
  Item *pIVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  ItemBlock *pIVar6;
  ulong uVar7;
  char *__dest;
  Item *pIVar8;
  long lVar9;
  Iterator *pIVar10;
  long lVar11;
  ulong uVar12;
  Item *unaff_R13;
  Item *pIVar13;
  
  do {
    if ((cell != &parent->right && (cell != &parent->left && parent != (Item *)0x0)) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x188,"!parent || cell == &parent->left || cell == &parent->right"),
       iVar5 != 0)) {
LAB_0010adb4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    pIVar13 = *cell;
    if (pIVar13 == (Item *)0x0) {
      pIVar13 = this->freeItem;
      if (pIVar13 == (Item *)0x0) {
        pIVar6 = (ItemBlock *)operator_new__(0x148);
        pIVar6->next = this->blocks;
        this->blocks = pIVar6;
        lVar9 = 8;
        lVar11 = 0;
        uVar12 = 0xffffffffffffffb8;
        do {
          uVar7 = uVar12;
          *(long *)((long)&pIVar6[0x13].next + uVar7) = lVar11;
          lVar11 = (long)&pIVar6->next + lVar9;
          lVar9 = lVar9 + 0x50;
          uVar12 = uVar7 + 0x50;
        } while (uVar7 + 0x50 < 0xf8);
        pIVar13 = (Item *)((long)&pIVar6[10].next + uVar7);
        this->freeItem = pIVar13;
      }
      pIVar13->key = *key;
      uVar1 = value->_len;
      (pIVar13->value)._len = uVar1;
      uVar12 = uVar1 + 1;
      __dest = (char *)operator_new__(uVar12);
      (pIVar13->value)._ptr = __dest;
      memcpy(__dest,value->_ptr,uVar12);
      pIVar13->parent = parent;
      pIVar13->left = (Item *)0x0;
      pIVar13->right = (Item *)0x0;
      pIVar13->height = 1;
      pIVar13->slope = 0;
      this->freeItem = pIVar13->prev;
      *cell = pIVar13;
      this->_size = this->_size + 1;
      if (parent == (Item *)0x0) {
        if (((this->_begin).item != &this->endItem) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x1a1,"_begin.item == &endItem"), iVar5 != 0)) goto LAB_0010adb4;
        pIVar13->prev = (Item *)0x0;
        pIVar13->next = (this->_begin).item;
        (this->_begin).item = pIVar13;
        (this->endItem).prev = pIVar13;
        bVar4 = true;
        parent = (Item *)0x0;
      }
      else {
        pIVar8 = parent;
        if (cell == &parent->right) {
          pIVar8 = parent->next;
        }
        pIVar2 = pIVar8->prev;
        pIVar13->prev = pIVar2;
        pIVar10 = &this->_begin;
        if (pIVar2 != (Item *)0x0) {
          pIVar10 = (Iterator *)&pIVar8->prev->next;
        }
        pIVar10->item = pIVar13;
        pIVar13->next = pIVar8;
        pIVar8->prev = pIVar13;
        do {
          uVar1 = parent->height;
          Item::updateHeightAndSlope(parent);
          parent = rebal(this,parent);
          bVar4 = true;
          if (uVar1 == parent->height) goto LAB_0010ad97;
          parent = parent->parent;
        } while (parent != (Item *)0x0);
        parent = (Item *)0x0;
      }
    }
    else {
      if (pIVar13->key < *key) {
        cell = &pIVar13->right;
      }
      else {
        if (pIVar13->key <= *key) {
          Error::Private::Str::operator=(&pIVar13->value,value);
          bVar4 = true;
          goto LAB_0010ad97;
        }
        cell = &pIVar13->left;
      }
      bVar4 = false;
      parent = pIVar13;
      pIVar13 = unaff_R13;
    }
LAB_0010ad97:
    unaff_R13 = pIVar13;
    if (bVar4) {
      return (Iterator)pIVar13;
    }
  } while( true );
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }